

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

Files * __thiscall
cmInstallTargetGenerator::GetFiles
          (Files *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NamelinkModeType NVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  cmInstallType cVar6;
  int iVar7;
  cmLocalGenerator *pcVar8;
  string *psVar9;
  long *plVar10;
  cmMakefile *this_01;
  cmValue cVar11;
  cmGlobalGenerator *pcVar12;
  pointer pcVar13;
  size_type sVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  _Alloc_hider _Var16;
  Files *this_02;
  string *obj;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string to1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string targetNameImportLib;
  string toSOName;
  string fromDirConfig;
  string fromRealName;
  Names targetNames;
  string toRealName;
  string local_218;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [24];
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string *local_88;
  string *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar17 = &(__return_storage_ptr__->FromDir).field_2;
  (__return_storage_ptr__->To).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->To).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->From).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->To).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->From).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->From).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->FromDir)._M_dataplus._M_p = (pointer)paVar17;
  (__return_storage_ptr__->FromDir)._M_string_length = 0;
  (__return_storage_ptr__->FromDir).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->ToDir).field_2;
  (__return_storage_ptr__->ToDir)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->ToDir)._M_string_length = 0;
  (__return_storage_ptr__->ToDir).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->NamelinkMode = NamelinkModeNone;
  __return_storage_ptr__->NoTweak = false;
  __return_storage_ptr__->UseSourcePermissions = false;
  __return_storage_ptr__->Type = cmInstallType_EXECUTABLE;
  cVar6 = cmGeneratorTarget::GetType(this->Target);
  switch(cVar6) {
  case cmInstallType_EXECUTABLE:
  case cmInstallType_STATIC_LIBRARY:
  case cmInstallType_SHARED_LIBRARY:
  case cmInstallType_MODULE_LIBRARY:
    __return_storage_ptr__->Type = cVar6;
    break;
  case cmInstallType_FILES:
    local_1f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1e8._0_8_ = (pointer)0x0;
    cmGeneratorTarget::GetTargetObjectNames
              (this->Target,config,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1f8);
    __return_storage_ptr__->Type = cmInstallType_FILES;
    __return_storage_ptr__->NoTweak = true;
    cmGeneratorTarget::GetObjectDirectory((string *)local_148,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FromDir,(string *)local_148);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    anon_unknown.dwarf_20821b2::computeInstallObjectDir((string *)local_148,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ToDir,(string *)local_148);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    uVar4 = local_1f8._8_8_;
    if (local_1f8._0_8_ != local_1f8._8_8_) {
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_
      ;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,pbVar15);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,pbVar15);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4
              );
    }
    this_02 = (Files *)local_1f8;
    goto LAB_004f5643;
  case cmInstallType_PROGRAMS:
  case cmInstallType_DIRECTORY:
  case 8:
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    local_148._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_148 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"cmInstallTargetGenerator created with non-installable target.",
               "");
    cmLocalGenerator::IssueMessage(pcVar8,INTERNAL_ERROR,(string *)local_148);
    sVar14 = local_148._16_8_;
    _Var16._M_p = (pointer)local_148._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_148 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_004f54af;
  case cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY:
    __assert_fail("false && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x8c,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_88 = &__return_storage_ptr__->FromDir;
  local_80 = &__return_storage_ptr__->ToDir;
  bVar5 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  local_78 = paVar1;
  if (bVar5) {
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar8);
    local_148._8_8_ = (psVar9->_M_dataplus)._M_p;
    local_148._0_8_ = psVar9->_M_string_length;
    local_148._16_8_ = 0x1c;
    local_148._24_8_ = "/CMakeFiles/CMakeRelink.dir/";
    views._M_len = 2;
    views._M_array = (iterator)local_148;
    cmCatViews_abi_cxx11_((string *)local_1f8,views);
    std::__cxx11::string::operator=((string *)&local_190,(string *)local_1f8);
    pcVar13 = (pointer)local_1e8._0_8_;
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8) {
LAB_004f4f71:
      operator_delete(pbVar15,(ulong)(pcVar13 + 1));
    }
  }
  else {
    cmGeneratorTarget::GetDirectory
              ((string *)local_1d0,this->Target,config,(uint)this->ImportLibrary);
    local_1e8._8_8_ = local_148 + 0x10;
    local_148._0_8_ = &DAT_00000001;
    local_148[0x10] = 0x2f;
    local_1f8._0_8_ = local_1d0._8_8_;
    local_1f8._8_8_ = local_1d0._0_8_;
    local_1e8._0_8_ = &DAT_00000001;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_1f8;
    local_148._8_8_ = local_1e8._8_8_;
    cmCatViews_abi_cxx11_(&local_218,views_00);
    std::__cxx11::string::operator=((string *)&local_190,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10)) {
      pcVar13 = (pointer)CONCAT71(local_1d0._17_7_,local_1d0[0x10]);
      pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_
      ;
      goto LAB_004f4f71;
    }
  }
  if (cVar6 == cmInstallType_EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0xb8,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
    cmGeneratorTarget::GetExecutableNames((Names *)local_148,this->Target,config);
    if (this->ImportLibrary == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_190,&local_e8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&local_218);
      local_1d0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d0[0x10] = '\0';
      local_1d0._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10);
      bVar5 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,&local_e8,(string *)local_1d0,(char *)0x0);
      if (bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity,
                          CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0])
                          + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10)) {
        operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
LAB_004f5388:
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_190,&local_128);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      bVar5 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar5) {
        this_01 = cmTarget::GetMakefile(this->Target->Target);
        local_1d0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_1d0[0x10] = '\0';
        this_00 = this->Target;
        local_1d0._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10)
        ;
        local_1b0._M_allocated_capacity = (size_type)&local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"BUNDLE_EXTENSION","");
        cVar11 = cmGeneratorTarget::GetProperty(this_00,(string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity,
                          CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0])
                          + 1);
        }
        if (cVar11.Value == (string *)0x0) {
          std::__cxx11::string::_M_replace((ulong)local_1d0,0,(char *)local_1d0._8_8_,0x7888fd);
        }
        else {
          std::__cxx11::string::_M_assign((string *)local_1d0);
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::__cxx11::string::append(local_1f8);
        std::__cxx11::string::_M_append(local_1f8,local_1d0._0_8_);
        std::__cxx11::string::append((char *)&local_218);
        std::__cxx11::string::_M_append((char *)&local_218,local_1d0._0_8_);
        std::__cxx11::string::append((char *)&local_218);
        bVar5 = cmMakefile::PlatformIsAppleEmbedded(this_01);
        if (!bVar5) {
          std::__cxx11::string::append((char *)&local_218);
        }
        std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_128._M_dataplus._M_p);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10))
        {
LAB_004f5aa4:
          operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
        }
      }
      else if ((local_108._M_string_length != local_128._M_string_length) ||
              ((local_108._M_string_length != 0 &&
               (iVar7 = bcmp(local_108._M_dataplus._M_p,local_128._M_dataplus._M_p,
                             local_108._M_string_length), iVar7 != 0)))) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0,&local_190,&local_108);
        local_1b0._M_allocated_capacity = (size_type)&local_1a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,local_108._M_dataplus._M_p,
                   local_108._M_dataplus._M_p + local_108._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity,
                          CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0])
                          + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10))
        goto LAB_004f5aa4;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_004f5388;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
  }
  else {
    cmGeneratorTarget::GetLibraryNames((Names *)local_148,this->Target,config);
    if (this->ImportLibrary == true) {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0xfa,
                      "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                     );
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_190,&local_e8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      local_170 = paVar17;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&local_218);
      local_1d0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d0[0x10] = '\0';
      local_1d0._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10);
      bVar5 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,&local_e8,(string *)local_1d0,(char *)0x0);
      if (bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity,
                          CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0])
                          + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10)) {
        operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
      }
      paVar17 = local_170;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
LAB_004f50d0:
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
LAB_004f50dd:
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8) {
LAB_004f50eb:
        operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
      }
LAB_004f50f8:
      bVar5 = true;
      bVar3 = false;
    }
    else {
      bVar5 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar5) {
        bVar5 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar5) {
          __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
          __return_storage_ptr__->UseSourcePermissions = true;
          std::__cxx11::string::find((char)&local_128,0x2f);
          std::__cxx11::string::substr((ulong)local_1f8,(ulong)&local_128);
          std::operator+(&local_218,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
          local_1d0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1d0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d0,local_128._M_dataplus._M_p,
                     local_128._M_dataplus._M_p + local_128._M_string_length);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_218);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0)
          ;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1d0 + 0x10)) {
            operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_004f50d0;
          goto LAB_004f50dd;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,&local_190,&local_128);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_128._M_dataplus._M_p,
                   local_128._M_dataplus._M_p + local_128._M_string_length);
        local_1d0._0_8_ = local_1d0 + 0x10;
        local_1d0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_1d0[0x10] = '\0';
        local_1b0._M_allocated_capacity = (size_type)&local_1a0;
        local_1b0._8_8_ = 0;
        local_1a0._M_local_buf[0] = '\0';
        local_170 = paVar17;
        if ((local_a8._M_string_length == local_128._M_string_length) &&
           ((local_a8._M_string_length == 0 ||
            (iVar7 = bcmp(local_a8._M_dataplus._M_p,local_128._M_dataplus._M_p,
                          local_a8._M_string_length), iVar7 == 0)))) {
          bVar5 = false;
        }
        else {
          std::operator+(&local_168,&local_190,&local_a8);
          std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                     local_168.field_2._M_local_buf[0]) + 1);
          }
          bVar5 = true;
          std::__cxx11::string::_M_assign((string *)local_1b0._M_local_buf);
        }
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        local_168._M_string_length = 0;
        local_168.field_2._M_local_buf[0] = '\0';
        paVar17 = &local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)paVar17;
        if (((local_108._M_string_length != local_128._M_string_length) ||
            ((local_108._M_string_length != 0 &&
             (iVar7 = bcmp(local_108._M_dataplus._M_p,local_128._M_dataplus._M_p,
                           local_108._M_string_length), iVar7 != 0)))) &&
           ((local_108._M_string_length != local_a8._M_string_length ||
            ((local_108._M_string_length != 0 &&
             (iVar7 = bcmp(local_108._M_dataplus._M_p,local_a8._M_dataplus._M_p,
                           local_108._M_string_length), iVar7 != 0)))))) {
          std::operator+(&local_50,&local_190,&local_108);
          std::__cxx11::string::operator=((string *)&local_168,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          bVar5 = true;
          std::__cxx11::string::_M_assign((string *)&local_70);
        }
        NVar2 = this->NamelinkMode;
        if (bVar5) {
          __return_storage_ptr__->NamelinkMode = NVar2;
          if (NVar2 != NamelinkModeOnly) {
            if (local_168._M_string_length != 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,&local_168);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &__return_storage_ptr__->To,&local_70);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d0);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &__return_storage_ptr__->To,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1b0);
            }
            if (this->NamelinkMode == NamelinkModeSkip) goto LAB_004f5c75;
          }
LAB_004f5c5c:
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,&local_218);
        }
        else if (NVar2 != NamelinkModeOnly) goto LAB_004f5c5c;
LAB_004f5c75:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar17) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        paVar17 = local_170;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity,
                          CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0])
                          + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 0x10))
        {
          operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_004f50d0;
        goto LAB_004f50dd;
      }
      if (this->NamelinkMode != NamelinkModeOnly) {
        if (this->NamelinkMode == NamelinkModeSkip) {
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          std::operator+(&local_218,"Target \'",psVar9);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_218);
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (plVar10 + 2);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10 ==
              pbVar15) {
            local_1e8._0_8_ = (pbVar15->_M_dataplus)._M_p;
            local_1e8._8_8_ = plVar10[3];
            local_1f8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
          }
          else {
            local_1e8._0_8_ = (pbVar15->_M_dataplus)._M_p;
            local_1f8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10;
          }
          local_1f8._8_8_ = plVar10[1];
          *plVar10 = (long)pbVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          pcVar12 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
          cmake::IssueMessage(pcVar12->CMakeInstance,AUTHOR_WARNING,(string *)local_1f8,
                              &(this->super_cmInstallGenerator).Backtrace);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8) {
            operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
          }
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,&local_190,&local_128);
        cmsys::SystemTools::GetFilenamePath(&local_218,(string *)local_1f8);
        std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_218);
        paVar1 = &local_218.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        local_218._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_108._M_dataplus._M_p,
                   local_108._M_dataplus._M_p + local_108._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8)
        goto LAB_004f50eb;
        goto LAB_004f50f8;
      }
      bVar3 = true;
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    if (!bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,
                        CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                 local_190.field_2._M_local_buf[0]) + 1);
      }
      if (bVar3) {
        return __return_storage_ptr__;
      }
      plVar10 = (long *)(local_80->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar10 != local_78) {
        operator_delete(plVar10,local_78->_M_allocated_capacity + 1);
      }
      plVar10 = (long *)(local_88->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar10 != paVar17) {
        operator_delete(plVar10,paVar17->_M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&__return_storage_ptr__->To);
      this_02 = __return_storage_ptr__;
LAB_004f5643:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&this_02->From);
      return __return_storage_ptr__;
    }
  }
  if ((long)(__return_storage_ptr__->From).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->From).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)(__return_storage_ptr__->To).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->To).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("files.From.size() == files.To.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x181,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    sVar14 = CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                      local_190.field_2._M_local_buf[0]);
    _Var16._M_p = local_190._M_dataplus._M_p;
LAB_004f54af:
    operator_delete(_Var16._M_p,sVar14 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(
  std::string const& config) const
{
  Files files;

  cmStateEnums::TargetType targetType = this->Target->GetType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      files.Type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      files.Type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      files.Type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      files.Type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY: {
      // Compute all the object files inside this target
      std::vector<std::string> objects;
      this->Target->GetTargetObjectNames(config, objects);

      files.Type = cmInstallType_FILES;
      files.NoTweak = true;
      files.FromDir = this->Target->GetObjectDirectory(config);
      files.ToDir = computeInstallObjectDir(this->Target, config);
      for (std::string& obj : objects) {
        files.From.emplace_back(obj);
        files.To.emplace_back(std::move(obj));
      }
      return files;
    }

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return files;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      cmStrCat(this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeRelink.dir/");
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig =
      cmStrCat(this->Target->GetDirectory(config, artifact), '/');
  }

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        std::string ext;
        if (cmValue p = this->Target->GetProperty("BUNDLE_EXTENSION")) {
          ext = *p;
        } else {
          ext = "app";
        }

        // Install the whole app bundle directory.
        files.Type = cmInstallType_DIRECTORY;
        files.UseSourcePermissions = true;
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = targetNames.Real;
          files.From.emplace_back(std::move(from2));
          files.To.emplace_back(std::move(to2));
        }
      }

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return files;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = targetNames.Real;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = targetNames.Output;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetNames.Output;
      std::string toName = targetNames.Output;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if (targetNames.SharedObject != targetNames.Output) {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNames.SharedObject;
        toSOName = targetNames.SharedObject;
      }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if (targetNames.Real != targetNames.Output &&
          targetNames.Real != targetNames.SharedObject) {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNames.Real;
        toRealName = targetNames.Real;
      }

      // Add the names based on the current namelink mode.
      if (haveNamelink) {
        files.NamelinkMode = this->NamelinkMode;
        // With a namelink we need to check the mode.
        if (this->NamelinkMode == NamelinkModeOnly) {
          // Install the namelink only.
          files.From.emplace_back(fromName);
          files.To.emplace_back(toName);
        } else {
          // Install the real file if it has its own name.
          if (!fromRealName.empty()) {
            files.From.emplace_back(fromRealName);
            files.To.emplace_back(toRealName);
          }

          // Install the soname link if it has its own name.
          if (!fromSOName.empty()) {
            files.From.emplace_back(fromSOName);
            files.To.emplace_back(toSOName);
          }

          // Install the namelink if it is not to be skipped.
          if (this->NamelinkMode != NamelinkModeSkip) {
            files.From.emplace_back(fromName);
            files.To.emplace_back(toName);
          }
        }
      } else {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if (this->NamelinkMode != NamelinkModeOnly) {
          files.From.emplace_back(fromName);
          files.To.emplace_back(toName);
        }
      }
    }
  }

  // If this fails the above code is buggy.
  assert(files.From.size() == files.To.size());

  return files;
}